

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O0

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::defer_event<afsm::test::events::command_complete>
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,command_complete *event,event_priority_type priority)

{
  anon_class_16_3_3ecbcd59 local_40;
  command_complete evt;
  lock_guard lock;
  event_priority_type priority_local;
  command_complete *event_local;
  priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *this_local;
  
  lock._M_device._4_4_ = priority;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->deferred_mutex_);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::
  defer_event<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::command_complete>
            (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,event);
  local_40.priority = lock._M_device._4_4_;
  local_40.this = this;
  std::
  priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
  ::
  emplace<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::defer_event<afsm::test::events::command_complete>(afsm::test::events::command_complete&&,int)::_lambda()_1_,int&>
            ((priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
              *)&this->deferred_events_,&local_40,(int *)((long)&lock._M_device + 4));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
    defer_event(Event&& event, event_priority_type priority)
    {
        lock_guard lock{deferred_mutex_};
        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace([&, evt, priority]() mutable {
            return process_event_dispatch(::std::move(evt), priority);
        }, priority);
    }